

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_sse.c
# Opt level: O1

void itrans_dst7_pb8_sse(s16 *coeff,s16 *block,int shift,int line,int limit_line,int max_tr_val,
                        int min_tr_val,s8 *iT)

{
  s8 *psVar1;
  int iVar2;
  ushort *puVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM8 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  
  iVar2 = 1 << ((char)shift - 1U & 0x1f);
  if (0 < line) {
    iVar5 = 0;
    auVar8 = ZEXT416((uint)shift);
    do {
      psVar1 = iT;
      iVar6 = 0;
      do {
        auVar9 = (undefined1  [16])0x0;
        lVar4 = 0;
        puVar3 = (ushort *)coeff;
        do {
          auVar11 = pshuflw(ZEXT216(*puVar3),ZEXT216(*puVar3),0);
          auVar10._0_4_ = auVar11._0_4_;
          auVar10._4_4_ = auVar10._0_4_;
          auVar10._8_4_ = auVar10._0_4_;
          auVar10._12_4_ = auVar10._0_4_;
          auVar11 = pshuflw(ZEXT216(puVar3[(uint)line]),ZEXT216(puVar3[(uint)line]),0);
          auVar11._4_4_ = auVar11._0_4_;
          auVar11._8_4_ = auVar11._0_4_;
          auVar11._12_4_ = auVar11._0_4_;
          auVar12 = pshuflw(ZEXT216(puVar3[(uint)(line * 2)]),ZEXT216(puVar3[(uint)(line * 2)]),0);
          auVar12._4_4_ = auVar12._0_4_;
          auVar12._8_4_ = auVar12._0_4_;
          auVar12._12_4_ = auVar12._0_4_;
          auVar13 = pshuflw(ZEXT216(puVar3[(uint)(line * 3)]),ZEXT216(puVar3[(uint)(line * 3)]),0);
          auVar14 = pmovsxbw(in_XMM7,*(undefined8 *)(psVar1 + lVar4));
          in_XMM8 = pmovsxbw(in_XMM8,*(undefined8 *)(psVar1 + lVar4 + 8));
          in_XMM9 = pmovsxbw(in_XMM9,*(undefined8 *)(psVar1 + lVar4 + 0x10));
          in_XMM10 = pmovsxbw(in_XMM10,*(undefined8 *)(psVar1 + lVar4 + 0x18));
          auVar13._4_4_ = auVar13._0_4_;
          auVar13._8_4_ = auVar13._0_4_;
          auVar13._12_4_ = auVar13._0_4_;
          auVar14 = pmovzxwd(auVar14,auVar14);
          auVar14 = pmaddwd(auVar14,auVar10);
          in_XMM7._0_4_ = auVar14._0_4_ + auVar9._0_4_;
          in_XMM7._4_4_ = auVar14._4_4_ + auVar9._4_4_;
          in_XMM7._8_4_ = auVar14._8_4_ + auVar9._8_4_;
          in_XMM7._12_4_ = auVar14._12_4_ + auVar9._12_4_;
          auVar9 = pmovzxwd(auVar9,in_XMM8);
          auVar11 = pmaddwd(auVar9,auVar11);
          auVar9 = pmovzxwd(auVar10,in_XMM9);
          auVar12 = pmaddwd(auVar9,auVar12);
          auVar9 = pmovzxwd(auVar11,in_XMM10);
          auVar10 = pmaddwd(auVar9,auVar13);
          auVar9._0_4_ = auVar10._0_4_ + auVar12._0_4_ + auVar11._0_4_ + in_XMM7._0_4_;
          auVar9._4_4_ = auVar10._4_4_ + auVar12._4_4_ + auVar11._4_4_ + in_XMM7._4_4_;
          auVar9._8_4_ = auVar10._8_4_ + auVar12._8_4_ + auVar11._8_4_ + in_XMM7._8_4_;
          auVar9._12_4_ = auVar10._12_4_ + auVar12._12_4_ + auVar11._12_4_ + in_XMM7._12_4_;
          lVar4 = lVar4 + 0x20;
          puVar3 = puVar3 + (uint)(line * 4);
        } while ((int)lVar4 == 0x20);
        auVar14._0_4_ = auVar9._0_4_ + iVar2 >> auVar8;
        auVar14._4_4_ = auVar9._4_4_ + iVar2 >> auVar8;
        auVar14._8_4_ = auVar9._8_4_ + iVar2 >> auVar8;
        auVar14._12_4_ = auVar9._12_4_ + iVar2 >> auVar8;
        auVar9 = packssdw(auVar14,auVar14);
        *(long *)block = auVar9._0_8_;
        coeff = (s16 *)((ushort *)coeff + ((ulong)(uint)(line * 4) * 2 - (ulong)(uint)(line * 8)));
        psVar1 = psVar1 + 4;
        block = block + 4;
        bVar7 = iVar6 == 0;
        iVar6 = iVar6 + 1;
      } while (bVar7);
      coeff = (s16 *)((ushort *)coeff + 1);
      iVar5 = iVar5 + 1;
    } while (iVar5 != line);
  }
  return;
}

Assistant:

void itrans_dst7_pb8_sse(s16 *coeff, s16 *block, int shift, int line, int limit_line, int max_tr_val, int min_tr_val, s8 *iT)
{
    int i, j, k;
    __m128i s0, s1, s2, s3;
    __m128i c0, c1, c2, c3;
    __m128i e0, e1, e2;
    __m128i r0, r1;
    __m128i zero = _mm_setzero_si128();
    __m128i rnd_factor = _mm_set1_epi32(1 << (shift - 1));
    for (i = 0; i < line; i++)
    {
        s8 *pb8 = iT;
        for (j = 0; j < 2; j++)
        {
            __m128i v0 = zero;
            for (k = 0; k < 2; k++)
            {
                //load src
                s0 = _mm_set1_epi16(coeff[0]);
                s1 = _mm_set1_epi16(coeff[line]);
                s2 = _mm_set1_epi16(coeff[2 * line]);
                s3 = _mm_set1_epi16(coeff[3 * line]);

                c0 = _mm_loadl_epi64((__m128i*)pb8);
                c0 = _mm_cvtepi8_epi16(c0);
                c1 = _mm_loadl_epi64((__m128i*)(pb8 + 8));
                c1 = _mm_cvtepi8_epi16(c1);
                c2 = _mm_loadl_epi64((__m128i*)(pb8 + 16));
                c2 = _mm_cvtepi8_epi16(c2);
                c3 = _mm_loadl_epi64((__m128i*)(pb8 + 24));
                c3 = _mm_cvtepi8_epi16(c3);
                c0 = _mm_unpacklo_epi16(c0, zero);
                c1 = _mm_unpacklo_epi16(c1, zero);
                c2 = _mm_unpacklo_epi16(c2, zero);
                c3 = _mm_unpacklo_epi16(c3, zero);

                e0 = _mm_add_epi32(_mm_madd_epi16(s0, c0), _mm_madd_epi16(s1, c1));
                e1 = _mm_add_epi32(_mm_madd_epi16(s2, c2), _mm_madd_epi16(s3, c3));
                e2 = _mm_add_epi32(e0, e1);

                v0 = _mm_add_epi32(v0, e2);

                pb8 += 32;
                coeff += (4 * line);
            }
            r0 = _mm_add_epi32(v0, rnd_factor);
            r1 = _mm_packs_epi32(_mm_srai_epi32(r0, shift), zero);
            _mm_storel_epi64((__m128i*)block, r1);
            coeff -= (8 * line);
            pb8 -= 60;
            block += 4;
        }
        coeff++;
    }
}